

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_provider.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::PixieProvider::PriceSyncVisitor::HandlePriceUpdateEvent
          (PriceSyncVisitor *this,uint32_t sid,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
          *price,SubjectSetRegister *subjectSetRegister,bool replaceAllFields)

{
  pointer pSVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  Subject subject;
  Subject local_40;
  
  uVar4 = (ulong)sid;
  pSVar1 = (this->subject_set_->
           super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->subject_set_->
                 super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) *
          -0x5555555555555555;
  if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
    price::subject::Subject::Subject(&local_40,pSVar1 + uVar4);
    bVar2 = SubjectSetRegister::IsCurrentlySubscribed(subjectSetRegister,&local_40);
    if (bVar2) {
      provider::AbstractProvider::PublishPriceUpdate
                (&this->pixie_provider->super_AbstractProvider,&local_40,price,replaceAllFields);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_40.components_);
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void PixieProvider::PriceSyncVisitor::HandlePriceUpdateEvent(uint32_t sid, std::map<std::string, PriceField>& price, SubjectSetRegister& subjectSetRegister,
                                                             bool replaceAllFields)
{
    Subject subject = subject_set_.at(sid);
    if (subjectSetRegister.IsCurrentlySubscribed(subject))
    {
        pixie_provider.PublishPriceUpdate(subject, price, replaceAllFields);
    }
}